

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::context_internal(context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *this,basic_context<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                         *a_ctx)

{
  this->ctx = a_ctx;
  delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::delimiter_set(&this->delim_set);
  (this->line_buffer).data._M_dataplus._M_p = (pointer)&(this->line_buffer).data.field_2;
  (this->line_buffer).data._M_string_length = 0;
  (this->line_buffer).data.field_2._M_local_buf[0] = L'\0';
  (this->line_buffer).contained_section_tag = false;
  return;
}

Assistant:

context_internal(basic_context<string_type>& a_ctx)
        : ctx(a_ctx)
    {
    }